

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O1

bool __thiscall Jinx::Impl::Parser::ParseStatement(Parser *this)

{
  pointer pDVar1;
  pointer pSVar2;
  pointer pFVar3;
  bool bVar4;
  uint32_t uVar5;
  RuntimeID id;
  mapped_type *this_00;
  size_t sVar6;
  size_t address;
  byte bVar7;
  bool bVar8;
  VisibilityType scope;
  char *pcVar9;
  byte bVar10;
  bool readOnly;
  byte bVar11;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  PropertyName propertyName;
  FunctionMatch functionMatch;
  DebugLineEntry local_a8;
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_90 [2];
  FunctionMatch local_40;
  
  if (this->m_error != false) {
    return false;
  }
  CheckFunctionCall(&local_40,this,false,(this->m_currentSymbol)._M_current,
                    (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish);
  if (local_40.signature != (FunctionSignature *)0x0) {
    ParseFunctionCall(this,&local_40);
    if ((CommonData::globalParams.enableDebugInfo == true) &&
       ((pDVar1 = (this->m_debugLines).
                  super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        (this->m_debugLines).
        super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_start == pDVar1 ||
        (pDVar1[-1].lineNumber != this->m_lastLine)))) {
      local_a0._4_4_ = this->m_lastLine;
      local_a0._0_4_ = (uint32_t)(this->m_writer).m_pos;
      std::
      vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
      ::emplace_back<Jinx::Impl::DebugLineEntry>(&this->m_debugLines,(DebugLineEntry *)local_a0);
    }
    BinaryWriter::Write<Jinx::Impl::Opcode,unsigned_char>(&this->m_writer,Pop);
    if (((this->m_error == false) &&
        (pSVar2 = (this->m_currentSymbol)._M_current,
        pSVar2 != (this->m_symbolList->
                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                  _M_impl.super__Vector_impl_data._M_finish)) && (pSVar2->type == NewLine)) {
      this->m_lastLine = pSVar2->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar2 + 1;
    }
    else {
      local_a0._0_8_ = CommonData::symbolTypeName[2];
      Error<char_const*>(this,"Expected symbol %s",(char **)local_a0);
    }
    bVar8 = false;
    goto LAB_00200fe1;
  }
  bVar8 = this->m_error;
  bVar11 = 1;
  bVar4 = true;
  if (bVar8 == false) {
    pSVar2 = (this->m_currentSymbol)._M_current;
    bVar4 = true;
    if ((pSVar2 != (this->m_symbolList->
                   super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                   _M_impl.super__Vector_impl_data._M_finish) && (bVar4 = true, pSVar2->type == Set)
       ) {
      this->m_lastLine = pSVar2->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar2 + 1;
      bVar4 = false;
    }
  }
  pcVar9 = "private";
  scope = Local;
  if ((bVar8 == false) &&
     (pSVar2 = (this->m_currentSymbol)._M_current, scope = Local,
     pSVar2 != (this->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish)) {
    pcVar9 = "private";
    if (pSVar2->type == Private) {
      scope = Private;
    }
    else {
      if (pSVar2->type != Public) goto LAB_0020079b;
      scope = Public;
      pcVar9 = "public";
    }
    this->m_lastLine = pSVar2->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar2 + 1;
    bVar11 = 0;
  }
LAB_0020079b:
  if (((bVar8 == false) &&
      (pSVar2 = (this->m_currentSymbol)._M_current,
      pSVar2 != (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish)) && (pSVar2->type == Readonly)) {
    this->m_lastLine = pSVar2->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar2 + 1;
    readOnly = true;
  }
  else {
    readOnly = false;
  }
  if ((bVar11 & readOnly) == 0) {
    if (((bVar8 == false) &&
        (pSVar2 = (this->m_currentSymbol)._M_current,
        pSVar2 != (this->m_symbolList->
                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                  _M_impl.super__Vector_impl_data._M_finish)) && (pSVar2->type == Function)) {
      this->m_lastLine = pSVar2->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar2 + 1;
      ParseFunctionDefinition(this,scope);
LAB_00200fd9:
      bVar11 = 0;
    }
    else {
      if (((!bVar4 && bVar8 == false) &&
          (pSVar2 = (this->m_currentSymbol)._M_current,
          pSVar2 != (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish)) && (pSVar2->type == NameValue)) {
        bVar8 = std::operator==(&((this->m_currentSymbol)._M_current)->text,
                                &((this->m_library).
                                  super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_name);
        if (bVar8) {
          pcVar9 = "Illegal use of library name in identifier";
          goto LAB_002007e0;
        }
        if (bVar11 == 0) {
          ParsePropertyDeclaration(this,scope,readOnly);
        }
        else {
          bVar8 = CheckProperty(this,(this->m_currentSymbol)._M_current,(size_t *)0x0);
          if (bVar8) {
            ParsePropertyName((PropertyName *)local_a0,this);
            if ((bool)local_a0[0xc] == true) {
              Error<>(this,"Can\'t change readonly property");
            }
            else {
              uVar5 = ParseSubscriptSet(this);
              Expect(this,To,(char *)0x0);
              ParseExpression(this,(this->m_symbolList->
                                   super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                   )._M_impl.super__Vector_impl_data._M_finish);
              Expect(this,NewLine,(char *)0x0);
              if (uVar5 == 0) {
                EmitOpcode(this,SetProp);
              }
              else {
                EmitOpcode(this,SetPropKeyVal);
                EmitCount(this,uVar5);
              }
              EmitId(this,local_a0._0_8_);
              local_a8.opcodePosition = local_a0._0_4_;
              local_a8.lineNumber = local_a0._4_4_;
              this_00 = std::
                        map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
                        ::operator[](&this->m_idNameMap,(key_type_conflict *)&local_a8);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              _M_assign(this_00,local_90);
            }
            PropertyName::~PropertyName((PropertyName *)local_a0);
            bVar10 = 0;
            bVar7 = 0;
            bVar11 = 0;
            if ((bool)local_a0[0xc] == false) goto LAB_00200fdc;
            goto LAB_00200fde;
          }
          local_a8.opcodePosition = 0x3f;
          local_a8.lineNumber = 0x14;
          symbols._M_len = 2;
          symbols._M_array = &local_a8.opcodePosition;
          ParseMultiName_abi_cxx11_((String *)local_a0,this,symbols);
          uVar5 = ParseSubscriptSet(this);
          Expect(this,To,(char *)0x0);
          ParseExpression(this,(this->m_symbolList->
                               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                               )._M_impl.super__Vector_impl_data._M_finish);
          Expect(this,NewLine,"Unable to parse expression");
          VariableAssign(this,(String *)local_a0);
          if (uVar5 == 0) {
            EmitOpcode(this,SetVar);
          }
          else {
            EmitOpcode(this,SetVarKeyVal);
            EmitCount(this,uVar5);
          }
          id = VariableNameToRuntimeID(this,(String *)local_a0);
          EmitId(this,id);
LAB_00200b6b:
          if ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_a0._0_8_
              != local_90) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            _M_destroy((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       local_a0,(size_type)local_90[0]._M_dataplus._M_p);
          }
        }
        goto LAB_00200fd9;
      }
      if (bVar11 == 0) {
        local_a0._0_8_ = pcVar9;
        Error<char_const*>(this,"Invalid symbol after scope specifier \'%s\'",(char **)local_a0);
        goto LAB_00200fd9;
      }
      pcVar9 = "Unknown symbol in statement";
      if (bVar8 != false) goto LAB_00200fd1;
      pSVar2 = (this->m_currentSymbol)._M_current;
      if ((pSVar2 == (this->m_symbolList->
                     super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                     _M_impl.super__Vector_impl_data._M_finish) || (pSVar2->type != Begin)) {
        pSVar2 = (this->m_currentSymbol)._M_current;
        if ((pSVar2 == (this->m_symbolList->
                       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)
                       ._M_impl.super__Vector_impl_data._M_finish) || (pSVar2->type != If)) {
          pSVar2 = (this->m_currentSymbol)._M_current;
          if ((pSVar2 == (this->m_symbolList->
                         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                         )._M_impl.super__Vector_impl_data._M_finish) || (pSVar2->type != Loop)) {
            pSVar2 = (this->m_currentSymbol)._M_current;
            if ((pSVar2 == (this->m_symbolList->
                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                           )._M_impl.super__Vector_impl_data._M_finish) || (pSVar2->type != Erase))
            {
              pSVar2 = (this->m_currentSymbol)._M_current;
              if (((pSVar2 == (this->m_symbolList->
                              super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                              )._M_impl.super__Vector_impl_data._M_finish) ||
                  (pSVar2->type != Increment)) &&
                 ((pSVar2 = (this->m_currentSymbol)._M_current,
                  pSVar2 == (this->m_symbolList->
                            super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                            )._M_impl.super__Vector_impl_data._M_finish ||
                  (pSVar2->type != Decrement)))) {
                pSVar2 = (this->m_currentSymbol)._M_current;
                if ((pSVar2 != (this->m_symbolList->
                               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                               )._M_impl.super__Vector_impl_data._M_finish) &&
                   (pSVar2->type == Return)) {
                  this->m_lastLine = pSVar2->lineNumber;
                  (this->m_currentSymbol)._M_current = pSVar2 + 1;
                  if ((long)(this->m_variableStackFrame).m_frames.
                            super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_variableStackFrame).m_frames.
                            super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
                    pSVar2 = (this->m_currentSymbol)._M_current;
                    if ((pSVar2 == (this->m_symbolList->
                                   super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                   )._M_impl.super__Vector_impl_data._M_finish) ||
                       (pSVar2->type != NewLine)) {
                      LogWriteLine(Warning,"Return values at root scope do nothing");
                      ParseExpression(this,(this->m_symbolList->
                                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                           )._M_impl.super__Vector_impl_data._M_finish);
                    }
                    EmitOpcode(this,Exit);
                  }
                  else {
                    pSVar2 = (this->m_currentSymbol)._M_current;
                    if ((pSVar2 == (this->m_symbolList->
                                   super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                   )._M_impl.super__Vector_impl_data._M_finish) ||
                       (pSVar2->type != NewLine)) {
                      ParseExpression(this,(this->m_symbolList->
                                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                           )._M_impl.super__Vector_impl_data._M_finish);
                    }
                    else {
                      EmitOpcode(this,PushVal);
                      local_a0._0_8_ = local_a0._0_8_ & 0xffffffff00000000;
                      Variant::Destroy((Variant *)local_a0);
                      local_a0._0_8_ = local_a0._0_8_ & 0xffffffff00000000;
                      Variant::Write((Variant *)local_a0,&this->m_writer);
                      Variant::Destroy((Variant *)local_a0);
                    }
                    EmitOpcode(this,Return);
                  }
                  bVar11 = 1;
                  if (((this->m_error == false) &&
                      (pSVar2 = (this->m_currentSymbol)._M_current,
                      pSVar2 != (this->m_symbolList->
                                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                )._M_impl.super__Vector_impl_data._M_finish)) &&
                     (pSVar2->type == NewLine)) {
                    this->m_lastLine = pSVar2->lineNumber;
                    (this->m_currentSymbol)._M_current = pSVar2 + 1;
                  }
                  goto LAB_00200fdc;
                }
                pSVar2 = (this->m_currentSymbol)._M_current;
                if ((pSVar2 == (this->m_symbolList->
                               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                               )._M_impl.super__Vector_impl_data._M_finish) ||
                   (pSVar2->type != Break)) {
                  pSVar2 = (this->m_currentSymbol)._M_current;
                  if ((pSVar2 == (this->m_symbolList->
                                 super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                 )._M_impl.super__Vector_impl_data._M_finish) ||
                     (pSVar2->type != Wait)) {
                    pSVar2 = (this->m_currentSymbol)._M_current;
                    if ((pSVar2 != (this->m_symbolList->
                                   super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                   )._M_impl.super__Vector_impl_data._M_finish) &&
                       (pSVar2->type == External)) {
                      this->m_lastLine = pSVar2->lineNumber;
                      (this->m_currentSymbol)._M_current = pSVar2 + 1;
                      bVar8 = CheckProperty(this,pSVar2 + 1,(size_t *)0x0);
                      ParseMultiName_abi_cxx11_
                                ((String *)local_a0,this,
                                 (initializer_list<Jinx::Impl::SymbolType>)ZEXT816(0));
                      pFVar3 = (this->m_variableStackFrame).m_frames.
                               super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      if ((long)pFVar3 -
                          (long)(this->m_variableStackFrame).m_frames.
                                super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
                        if ((long)pFVar3[-1].stack.
                                  super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)pFVar3[-1].stack.
                                  super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start == 0x30) {
                          if (bVar8) {
                            local_a8.opcodePosition = local_a0._0_4_;
                            local_a8.lineNumber = local_a0._4_4_;
                            Error<char_const*>(this,
                                               "External variable \'%s\' is already a property name"
                                               ,(char **)&local_a8);
                          }
                          else {
                            bVar8 = VariableStackFrame::VariableExists
                                              (&this->m_variableStackFrame,(String *)local_a0);
                            if (bVar8) {
                              local_a8.opcodePosition = local_a0._0_4_;
                              local_a8.lineNumber = local_a0._4_4_;
                              Error<char_const*>(this,"Variable \'%s\' already exists",
                                                 (char **)&local_a8);
                            }
                            else {
                              bVar8 = VariableStackFrame::VariableAssign
                                                (&this->m_variableStackFrame,(String *)local_a0);
                              if (!bVar8) {
                                local_a8.opcodePosition = local_a0._0_4_;
                                local_a8.lineNumber = local_a0._4_4_;
                                Error<char_const*>(this,"Error creating external variable \'%s\'",
                                                   (char **)&local_a8);
                              }
                            }
                          }
                        }
                        else {
                          local_a8.opcodePosition = local_a0._0_4_;
                          local_a8.lineNumber = local_a0._4_4_;
                          Error<char_const*>(this,
                                             "External variable \'%s\' must be declared at the root scope"
                                             ,(char **)&local_a8);
                        }
                      }
                      else {
                        local_a8.opcodePosition = local_a0._0_4_;
                        local_a8.lineNumber = local_a0._4_4_;
                        Error<char_const*>(this,
                                           "External variable \'%s\' can\'t be declared in a function"
                                           ,(char **)&local_a8);
                      }
                      Expect(this,NewLine,(char *)0x0);
                      goto LAB_00200b6b;
                    }
                  }
                  else {
                    this->m_lastLine = pSVar2->lineNumber;
                    (this->m_currentSymbol)._M_current = pSVar2 + 1;
                    pcVar9 = "Unexpected symbol after wait";
                    pSVar2 = (this->m_currentSymbol)._M_current;
                    if ((pSVar2 != (this->m_symbolList->
                                   super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                   )._M_impl.super__Vector_impl_data._M_finish) &&
                       (pSVar2->type == NewLine)) {
                      this->m_lastLine = pSVar2->lineNumber;
                      (this->m_currentSymbol)._M_current = pSVar2 + 1;
                      EmitOpcode(this,Wait);
                      goto LAB_00200fd9;
                    }
                    pSVar2 = (this->m_currentSymbol)._M_current;
                    if (((pSVar2 != (this->m_symbolList->
                                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                    )._M_impl.super__Vector_impl_data._M_finish) &&
                        (pSVar2->type == Until)) ||
                       ((pSVar2 = (this->m_currentSymbol)._M_current,
                        pSVar2 != (this->m_symbolList->
                                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                  )._M_impl.super__Vector_impl_data._M_finish &&
                        (pSVar2->type == While)))) {
                      pSVar2 = (this->m_currentSymbol)._M_current;
                      if ((pSVar2 == (this->m_symbolList->
                                     super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                     )._M_impl.super__Vector_impl_data._M_finish) ||
                         (pSVar2->type != Until)) {
                        bVar11 = 0;
                      }
                      else {
                        this->m_lastLine = pSVar2->lineNumber;
                        (this->m_currentSymbol)._M_current = pSVar2 + 1;
                        bVar11 = 1;
                      }
                      sVar6 = (this->m_writer).m_pos;
                      if (bVar11 == 0) {
                        Expect(this,While,(char *)0x0);
                      }
                      ParseExpression(this,(this->m_symbolList->
                                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                           )._M_impl.super__Vector_impl_data._M_finish);
                      bVar8 = Expect(this,NewLine,(char *)0x0);
                      if (bVar8) {
                        EmitOpcode(this,(uint)bVar11 * 2 + JumpFalse);
                        address = EmitAddressPlaceholder(this);
                        EmitOpcode(this,Wait);
                        EmitOpcode(this,Jump);
                        EmitAddress(this,sVar6);
                        EmitAddressBackfill(this,address);
                        bVar10 = 0;
                        bVar7 = 0;
                        bVar11 = 0;
                        if (!bVar8) goto LAB_00200fde;
                        goto LAB_00200fdc;
                      }
                      goto LAB_002007e8;
                    }
                  }
LAB_00200fd1:
                  Error<>(this,pcVar9);
                }
                else {
                  this->m_lastLine = pSVar2->lineNumber;
                  (this->m_currentSymbol)._M_current = pSVar2 + 1;
                  Expect(this,NewLine,(char *)0x0);
                  EmitOpcode(this,Jump);
                  sVar6 = EmitAddressPlaceholder(this);
                  this->m_breakAddress = sVar6;
                }
              }
              else {
                ParseIncDec(this);
              }
            }
            else {
              this->m_lastLine = pSVar2->lineNumber;
              (this->m_currentSymbol)._M_current = pSVar2 + 1;
              ParseErase(this);
            }
          }
          else {
            this->m_lastLine = pSVar2->lineNumber;
            (this->m_currentSymbol)._M_current = pSVar2 + 1;
            ParseLoop(this);
          }
        }
        else {
          this->m_lastLine = pSVar2->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar2 + 1;
          ParseIfElse(this);
        }
        goto LAB_00200fd9;
      }
      this->m_lastLine = pSVar2->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar2 + 1;
      Expect(this,NewLine,(char *)0x0);
      ParseBlock(this);
      Expect(this,End,(char *)0x0);
      Expect(this,NewLine,(char *)0x0);
      bVar11 = 0;
    }
LAB_00200fdc:
    bVar10 = bVar11;
    bVar7 = 1;
  }
  else {
    pcVar9 = "The \'readonly\' keyword must follow a private or public keyword";
LAB_002007e0:
    Error<>(this,pcVar9);
LAB_002007e8:
    bVar7 = 0;
    bVar10 = 0;
  }
LAB_00200fde:
  bVar8 = (bool)(bVar7 & bVar10);
LAB_00200fe1:
  std::
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ::~_Vector_base(&local_40.partData.
                   super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                 );
  return bVar8;
}

Assistant:

inline bool Parser::ParseStatement()
	{
		// No need to continue if an error has been flagged
		if (m_error)
			return false;

		bool returnedValue = false;

		// Functions signatures have precedence over everything, so check for a 
		// potential signature match before anything else.
		const auto functionMatch = CheckFunctionCall();
		if (functionMatch.signature)
		{
			// We found a valid function signature that matches the current token(s)
			ParseFunctionCall(functionMatch);

			// Since all functions return a value, we need to discard the return
			// value not on the stack, since we're not assigning it to a variable.
			EmitOpcode(Opcode::Pop);
			Expect(SymbolType::NewLine);
		}
		else
		{
			bool set = Accept(SymbolType::Set);

			// Parse scope level
			VisibilityType scope = ParseScope();

			// Parse optional readonly, which can only apply to properties
			bool readOnly = Accept(SymbolType::Readonly);
			if (readOnly)
			{
				if (scope == VisibilityType::Local)
				{
					Error("The 'readonly' keyword must follow a private or public keyword");
					return false;
				}
			}

			if (Accept(SymbolType::Function))
			{
				// We're parsing a function definition
				ParseFunctionDefinition(scope);
			}
			else if (set && CheckName())
			{
				// Can't use the current library name or preface the variable with it
				if (m_currentSymbol->text == m_library->GetName())
				{
					Error("Illegal use of library name in identifier");
					return false;
				}

				// We're declaring a new property if we see a non-local scope declaration
				if (scope != VisibilityType::Local)
				{
					ParsePropertyDeclaration(scope, readOnly);
				}
				// Either this is an existing property or a variable
				else
				{
					// Check to see if this is an existing property
					if (CheckProperty())
					{
						// Get the property name
						auto propertyName = ParsePropertyName();

						// Make sure we're not trying to assign a value to a readonly property
						if (propertyName.IsReadOnly())
						{
							Error("Can't change readonly property");
							return false;
						}

						// Check for subscript operators
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine);

						// Assign property
						if (subscripts)
						{
							EmitOpcode(Opcode::SetPropKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetProp);

						EmitId(propertyName.GetId());
						m_idNameMap[propertyName.GetId()] = propertyName.GetName();
					}
					// Otherwise we're just dealing with an ordinary variable
					else
					{
						// Get the variable name
						String name = ParseMultiName({ SymbolType::To, SymbolType::SquareOpen });

						// Check for subscript operator
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine, "Unable to parse expression");

						// Add to variable table
						VariableAssign(name);

						// Assign a variable. 
						if (subscripts)
						{
							EmitOpcode(Opcode::SetVarKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetVar);
						EmitId(VariableNameToRuntimeID(name));
					}
				}
			}
			else if (scope == VisibilityType::Local)
			{
				if (Accept(SymbolType::Begin))
				{
					// We're parsing a begin/end block
					Expect(SymbolType::NewLine);
					ParseBlock();
					Expect(SymbolType::End);
					Expect(SymbolType::NewLine);
				}
				else if (Accept(SymbolType::If))
				{
					// We're parsing an if or if/else block
					ParseIfElse();
				}
				else if (Accept(SymbolType::Loop))
				{
					// We're parsing a loop block
					ParseLoop();
				}
				else if (Accept(SymbolType::Erase))
				{
					// We're parsing an erase operation
					ParseErase();
				}
				else if (Check(SymbolType::Increment) || Check(SymbolType::Decrement))
				{
					// We're parsing an increment or decrement statement
					ParseIncDec();
				}
				else if (Accept(SymbolType::Return))
				{
					// We've hit a return value.  There are different behaviors depending whether or
					// not we're at the base scope or not.
					if (m_variableStackFrame.IsRootFrame())
					{
						if (!Check(SymbolType::NewLine))
						{
							LogWriteLine(LogLevel::Warning, "Return values at root scope do nothing");
							ParseExpression();
						}
						EmitOpcode(Opcode::Exit);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
					else
					{
						if (!Check(SymbolType::NewLine))
						{
							ParseExpression();
						}
						else
						{
							EmitOpcode(Opcode::PushVal);
							EmitValue(nullptr);
						}
						EmitOpcode(Opcode::Return);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
				}
				else if (Accept(SymbolType::Break))
				{
					// We've hit a break statement
					Expect(SymbolType::NewLine);
					EmitOpcode(Opcode::Jump);
					m_breakAddress = EmitAddressPlaceholder();
				}
				else if (Accept(SymbolType::Wait))
				{
					// Check for basic wait statement
					if (Accept(SymbolType::NewLine))
						EmitOpcode(Opcode::Wait);
					else if (Check(SymbolType::Until) || Check(SymbolType::While))
					{
						// Store expression address
						auto expressionAddress = m_writer.Tell();

						// Check which keyword was used
						bool jumpTrue = Accept(SymbolType::Until);
						if (!jumpTrue)
							Expect(SymbolType::While);

						// Parse the expression to check for wait
						ParseExpression();
						if (!Expect(SymbolType::NewLine))
							return false;

						// Add jump if false/true over wait statement depending on keyword
						EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);

						// Mark placeholder for later jump address insertion
						auto addressPlaceholder = EmitAddressPlaceholder();

						// Wait statement is executed if expression is true
						EmitOpcode(Opcode::Wait);
						EmitOpcode(Opcode::Jump);
						EmitAddress(expressionAddress);

						// Backfill placeholder at end of conditional wait statement
						EmitAddressBackfill(addressPlaceholder);
					}
					else
					{
						Error("Unexpected symbol after wait");
					}
				}
				else if (Accept(SymbolType::External))
				{
					// First check to see if this collides with an existing property name
					bool propExists = CheckProperty();

					// Get the variable name
					String name = ParseMultiName({ });

					// Validate the name is legal and register it as a variable name
					if (!m_variableStackFrame.IsRootFrame())
						Error("External variable '%s' can't be declared in a function", name.c_str());
					else if (!m_variableStackFrame.IsRootScope())
						Error("External variable '%s' must be declared at the root scope", name.c_str());
					else if (propExists)
						Error("External variable '%s' is already a property name", name.c_str());
					else if (m_variableStackFrame.VariableExists(name))
						Error("Variable '%s' already exists", name.c_str());
					else if (!m_variableStackFrame.VariableAssign(name))
						Error("Error creating external variable '%s'", name.c_str());

					Expect(SymbolType::NewLine);
				}
				else
				{
					Error("Unknown symbol in statement");
				}
			}
			else
			{
				Error("Invalid symbol after scope specifier '%s'", scope == VisibilityType::Public ? "public" : "private");
			}
		}

		// This is not an error value, but signals whether we've returned a value from this statement
		return returnedValue;
	}